

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O2

void __thiscall validation_layer::eventsChecker::eventsChecker(eventsChecker *this)

{
  bool bVar1;
  ZEeventsChecker *this_00;
  undefined8 *puVar2;
  validationChecker *local_20;
  
  this->enableEvents = false;
  bVar1 = getenv_tobool("ZEL_ENABLE_EVENTS_CHECKER");
  this->enableEvents = bVar1;
  if (bVar1) {
    this_00 = (ZEeventsChecker *)operator_new(0x80);
    ZEeventsChecker::ZEeventsChecker(this_00);
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = &PTR_zesInitPrologue_001d6968;
    DAT_001dc6c8 = (undefined8 *)operator_new(8);
    *DAT_001dc6c8 = &PTR_zetModuleGetDebugInfoPrologue_001d72f0;
    local_20 = (validationChecker *)&events_checker;
    events_checker = this_00;
    DAT_001dc6c0 = puVar2;
    std::
    vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
    ::emplace_back<validation_layer::validationChecker*>
              ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
                *)(context + 0xd30),&local_20);
  }
  return;
}

Assistant:

eventsChecker::eventsChecker() {

    enableEvents = getenv_tobool("ZEL_ENABLE_EVENTS_CHECKER");
    if (enableEvents) {
        eventsChecker::ZEeventsChecker *zeChecker = new eventsChecker::ZEeventsChecker;
        eventsChecker::ZESeventsChecker *zesChecker = new eventsChecker::ZESeventsChecker;
        eventsChecker::ZETeventsChecker *zetChecker = new eventsChecker::ZETeventsChecker;
        events_checker.zeValidation = zeChecker;
        events_checker.zesValidation = zesChecker;
        events_checker.zetValidation = zetChecker;

        validation_layer::context.validationHandlers.push_back(&events_checker);
    }
}